

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit.h
# Opt level: O3

bool __thiscall
bandit::run_policy::bandit::should_run(bandit *this,string *it_name,stack_t *contexts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pfVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  pointer pfVar7;
  filter_chain_element filter;
  string local_60;
  char local_40;
  string *local_38;
  
  if ((this->dry_run_ != false) ||
     (((local_38 = it_name, this->break_on_failure_ == true &&
       (iVar5 = (*(this->super_interface)._vptr_interface[4])(this), (char)iVar5 != '\0')) ||
      (bVar4 = has_context_with_hard_skip(this,contexts), bVar4)))) {
LAB_00111e9d:
    bVar4 = false;
  }
  else {
    pfVar7 = (this->filter_chain_).
             super__Vector_base<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pfVar2 = (this->filter_chain_).
             super__Vector_base<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = true;
    if (pfVar7 != pfVar2) {
      paVar1 = &local_60.field_2;
      do {
        pcVar3 = (pfVar7->pattern)._M_dataplus._M_p;
        local_60._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar3,pcVar3 + (pfVar7->pattern)._M_string_length);
        local_40 = pfVar7->skip;
        bVar4 = context_matches_pattern(this,contexts,&local_60);
        if (bVar4) {
          if (local_40 != '\0') {
LAB_00111f4b:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != paVar1) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            goto LAB_00111e9d;
          }
        }
        else {
          lVar6 = std::__cxx11::string::find((char *)local_38,(ulong)local_60._M_dataplus._M_p,0);
          if ((lVar6 != -1) == (bool)local_40) goto LAB_00111f4b;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pfVar7 = pfVar7 + 1;
      } while (pfVar7 != pfVar2);
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool should_run(const std::string& it_name, const context::stack_t& contexts) const override {
        if (dry_run_) {
          return false;
        }

        if (break_on_failure_ && has_encountered_failure()) {
          return false;
        }

        // Never run if a context has been marked as skip
        // using 'describe_skip'
        if (has_context_with_hard_skip(contexts)) {
          return false;
        }

        // Now go through the filter chain
        for (auto filter : filter_chain_) {
          bool match = context_matches_pattern(contexts, filter.pattern) || matches_pattern(it_name, filter.pattern);
          bool skip_applies = filter.skip && match;
          bool only_applies = !filter.skip && !match;
          if (skip_applies || only_applies) {
            return false;
          }
        }

        return true;
      }